

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O2

int32_t readl_bfr(Btor2Parser *bfr)

{
  int64_t lineno;
  uint32_t nargs;
  int32_t iVar1;
  int iVar2;
  int64_t absid;
  int64_t *piVar3;
  Btor2Line *l;
  void *__s;
  ulong *__ptr;
  ulong *puVar4;
  Btor2Line *pBVar5;
  int64_t absid_1;
  ulong uVar6;
  char *pcVar7;
  char *fmt;
  Btor2Tag BVar8;
  ulong uVar9;
  long lVar10;
  ulong *puVar11;
  ulong uVar12;
  Btor2Line *local_a0;
  Btor2Sort tmp;
  int64_t id;
  Btor2Sort local_58;
  
  while( true ) {
    do {
      do {
        iVar1 = getc_bfr(bfr);
      } while (iVar1 == 10);
    } while (iVar1 == 0x20);
    if (iVar1 != 0x3b) break;
    iVar1 = skip_comment(bfr);
    if (iVar1 == 0) {
      return 0;
    }
  }
  if (iVar1 == -1) {
    return 0;
  }
  if (iVar1 == 9) {
    pcVar7 = "unexpected tab character at start of line";
    goto LAB_001017dd;
  }
  bfr->saved = iVar1;
  iVar1 = parse_id_bfr(bfr,&id);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = getc_bfr(bfr);
  if (iVar1 != 0x20) {
    pcVar7 = "expected space after id";
    goto LAB_001017dd;
  }
  if (id < bfr->ntable) {
    lVar10 = -id;
    if (0 < id) {
      lVar10 = id;
    }
    if ((lVar10 < bfr->ntable && id != 0) && (bfr->table[lVar10] != (Btor2Line *)0x0)) {
      pcVar7 = "id already defined";
    }
    else {
      pcVar7 = "id out-of-order";
    }
    goto LAB_001017dd;
  }
  lineno = bfr->lineno;
  pcVar7 = parse_tag(bfr);
  if (pcVar7 == (char *)0x0) {
    return 0;
  }
  switch(*pcVar7) {
  case 'a':
    iVar2 = strcmp(pcVar7,"add");
    if (iVar2 == 0) {
      pcVar7 = "add";
      BVar8 = BTOR2_TAG_add;
    }
    else {
      iVar2 = strcmp(pcVar7,"and");
      if (iVar2 != 0) goto switchD_00101798_caseD_67;
      pcVar7 = "and";
      BVar8 = BTOR2_TAG_and;
    }
    break;
  case 'b':
    iVar2 = strcmp(pcVar7,"bad");
    if (iVar2 != 0) goto switchD_00101798_caseD_67;
    pcVar7 = "bad";
    BVar8 = BTOR2_TAG_bad;
LAB_00101f91:
    l = new_line_bfr(bfr,id,lineno,pcVar7,BVar8);
    iVar2 = parse_constraint_bfr(bfr,l);
    goto LAB_001026fe;
  case 'c':
    iVar2 = strcmp(pcVar7,"constraint");
    if (iVar2 == 0) {
      pcVar7 = "constraint";
      BVar8 = BTOR2_TAG_constraint;
      goto LAB_00101f91;
    }
    iVar2 = strcmp(pcVar7,"concat");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar7,"const");
      if (iVar2 == 0) {
        pcVar7 = "const";
        BVar8 = BTOR2_TAG_const;
      }
      else {
        iVar2 = strcmp(pcVar7,"constd");
        if (iVar2 == 0) {
          pcVar7 = "constd";
          BVar8 = BTOR2_TAG_constd;
        }
        else {
          iVar2 = strcmp(pcVar7,"consth");
          if (iVar2 != 0) goto switchD_00101798_caseD_67;
          pcVar7 = "consth";
          BVar8 = BTOR2_TAG_consth;
        }
      }
      goto LAB_00102102;
    }
    pcVar7 = "concat";
    BVar8 = BTOR2_TAG_concat;
    break;
  case 'd':
    iVar2 = strcmp(pcVar7,"dec");
    if (iVar2 == 0) {
      pcVar7 = "dec";
      BVar8 = BTOR2_TAG_dec;
LAB_001020d6:
      l = new_line_bfr(bfr,id,lineno,pcVar7,BVar8);
      iVar2 = parse_unary_op_bfr(bfr,l);
      goto LAB_001026fe;
    }
    goto switchD_00101798_caseD_67;
  case 'e':
    if ((pcVar7[1] != 'q') || (pcVar7[2] != '\0')) goto switchD_00101798_caseD_67;
    pcVar7 = "eq";
    BVar8 = BTOR2_TAG_eq;
    break;
  case 'f':
    iVar2 = strcmp(pcVar7,"fair");
    if (iVar2 == 0) {
      pcVar7 = "fair";
      BVar8 = BTOR2_TAG_fair;
      goto LAB_00101f91;
    }
  default:
    goto switchD_00101798_caseD_67;
  case 'i':
    iVar2 = strcmp(pcVar7,"implies");
    if (iVar2 == 0) {
      pcVar7 = "implies";
      BVar8 = BTOR2_TAG_implies;
    }
    else {
      iVar2 = strcmp(pcVar7,"iff");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar7,"inc");
        if (iVar2 == 0) {
          pcVar7 = "inc";
          BVar8 = BTOR2_TAG_inc;
          goto LAB_001020d6;
        }
        iVar2 = strcmp(pcVar7,"init");
        if (iVar2 == 0) {
          l = new_line_bfr(bfr,id,lineno,"init",BTOR2_TAG_init);
          iVar1 = parse_sort_id_bfr(bfr,&l->sort);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = parse_args(bfr,l,2);
          if (iVar1 == 0) {
            return 0;
          }
          uVar12 = *l->args;
          if ((long)uVar12 < 0) {
LAB_001022a8:
            pcVar7 = "invalid negated first argument";
            goto LAB_001017dd;
          }
          if ((uVar12 == 0) || (bfr->ntable <= (long)uVar12)) {
            local_a0 = (Btor2Line *)0x0;
          }
          else {
            local_a0 = bfr->table[uVar12];
          }
          if (local_a0->tag == BTOR2_TAG_state) {
            uVar6 = l->args[1];
            uVar9 = -uVar6;
            if (0 < (long)uVar6) {
              uVar9 = uVar6;
            }
            if (uVar12 < uVar9) {
              pcVar7 = "state id must be greater than id of second operand";
              goto LAB_001017dd;
            }
            __s = btor2parser_malloc(uVar9 + 1);
            memset(__s,0,uVar9 + 1);
            __ptr = (ulong *)btorsim_realloc((void *)0x0,8);
            *__ptr = uVar6;
            puVar4 = __ptr + 1;
            puVar11 = puVar4;
            do {
              uVar12 = puVar11[-1];
              puVar11 = puVar11 + -1;
              uVar6 = -uVar12;
              if (0 < (long)uVar12) {
                uVar6 = uVar12;
              }
              if (*(char *)((long)__s + uVar6) == '\0') {
                *(undefined1 *)((long)__s + uVar6) = 1;
                pBVar5 = bfr->table[uVar6];
                if (pBVar5->tag == BTOR2_TAG_input) {
                  perr_bfr(bfr,
                           "inputs are not allowed in initialization expressions, use a state instead of input %ld."
                          );
                  free(__s);
                  free(__ptr);
                  return 0;
                }
                for (uVar12 = 0; uVar12 < pBVar5->nargs; uVar12 = uVar12 + 1) {
                  if (puVar11 == puVar4) {
                    lVar10 = (long)puVar11 - (long)__ptr;
                    uVar6 = (ulong)((long)puVar11 - (long)__ptr) >> 2;
                    if (lVar10 == 0) {
                      uVar6 = 1;
                    }
                    __ptr = (ulong *)btorsim_realloc(__ptr,uVar6 * 8);
                    puVar11 = (ulong *)(lVar10 + (long)__ptr);
                    puVar4 = __ptr + uVar6;
                  }
                  *puVar11 = pBVar5->args[uVar12];
                  puVar11 = puVar11 + 1;
                }
              }
            } while (puVar11 != __ptr);
            free(__s);
            free(__ptr);
            if (local_a0->init != 0) {
              pcVar7 = (char *)local_a0->id;
              fmt = "state %ld initialized twice";
              goto LAB_00101f2c;
            }
            local_a0->init = l->args[1];
            pusht_bfr(bfr,l);
            iVar2 = check_sorts_bfr(bfr,l);
            goto joined_r0x001025d2;
          }
LAB_0010238e:
          pcVar7 = "expected state as first argument";
LAB_001017dd:
          perr_bfr(bfr,pcVar7);
          return 0;
        }
        iVar2 = strcmp(pcVar7,"input");
        if (iVar2 == 0) {
          pcVar7 = "input";
          BVar8 = BTOR2_TAG_input;
LAB_0010225a:
          l = new_line_bfr(bfr,id,lineno,pcVar7,BVar8);
          iVar2 = parse_sort_id_bfr(bfr,&l->sort);
          goto LAB_001026fe;
        }
        iVar2 = strcmp(pcVar7,"ite");
        if (iVar2 == 0) {
          pcVar7 = "ite";
          BVar8 = BTOR2_TAG_ite;
          goto LAB_00101df4;
        }
        goto switchD_00101798_caseD_67;
      }
      pcVar7 = "iff";
      BVar8 = BTOR2_TAG_iff;
    }
    break;
  case 'j':
    iVar2 = strcmp(pcVar7,"justice");
    if (iVar2 == 0) {
      l = new_line_bfr(bfr,id,lineno,"justice",BTOR2_TAG_justice);
      iVar1 = parse_pos_number_bfr(bfr,(uint32_t *)&tmp);
      if (iVar1 == 0) {
        return 0;
      }
      nargs = (uint32_t)tmp.id;
      piVar3 = (int64_t *)btor2parser_realloc(l->args,(tmp.id & 0xffffffffU) << 3);
      l->args = piVar3;
      l->nargs = nargs;
      iVar2 = parse_args(bfr,l,nargs);
      goto LAB_001026fe;
    }
    goto switchD_00101798_caseD_67;
  case 'm':
    iVar2 = strcmp(pcVar7,"mul");
    if (iVar2 != 0) goto switchD_00101798_caseD_67;
    pcVar7 = "mul";
    BVar8 = BTOR2_TAG_mul;
    break;
  case 'n':
    iVar2 = strcmp(pcVar7,"nand");
    if (iVar2 == 0) {
      pcVar7 = "nand";
      BVar8 = BTOR2_TAG_nand;
    }
    else {
      iVar2 = strcmp(pcVar7,"neq");
      if (iVar2 != 0) {
        iVar2 = strcmp(pcVar7,"neg");
        if (iVar2 == 0) {
          pcVar7 = "neg";
          BVar8 = BTOR2_TAG_neg;
        }
        else {
          iVar2 = strcmp(pcVar7,"next");
          if (iVar2 == 0) {
            l = new_line_bfr(bfr,id,lineno,"next",BTOR2_TAG_next);
            iVar1 = parse_sort_id_bfr(bfr,&l->sort);
            if (iVar1 == 0) {
              return 0;
            }
            iVar1 = parse_args(bfr,l,2);
            if (iVar1 == 0) {
              return 0;
            }
            lVar10 = *l->args;
            if (lVar10 < 0) goto LAB_001022a8;
            if ((lVar10 == 0) || (bfr->ntable <= lVar10)) {
              pBVar5 = (Btor2Line *)0x0;
            }
            else {
              pBVar5 = bfr->table[lVar10];
            }
            if (pBVar5->tag == BTOR2_TAG_state) {
              if (pBVar5->next != 0) {
                pcVar7 = (char *)pBVar5->id;
                fmt = "next for state %ld set twice";
                goto LAB_00101f2c;
              }
              pBVar5->next = l->args[1];
              goto LAB_00102706;
            }
            goto LAB_0010238e;
          }
          iVar2 = strcmp(pcVar7,"nor");
          if (iVar2 == 0) {
            pcVar7 = "nor";
            BVar8 = BTOR2_TAG_nor;
            break;
          }
          iVar2 = strcmp(pcVar7,"not");
          if (iVar2 != 0) goto switchD_00101798_caseD_67;
          pcVar7 = "not";
          BVar8 = BTOR2_TAG_not;
        }
        goto LAB_001020d6;
      }
      pcVar7 = "neq";
      BVar8 = BTOR2_TAG_neq;
    }
    break;
  case 'o':
    iVar2 = strcmp(pcVar7,"one");
    if (iVar2 == 0) {
      pcVar7 = "one";
      BVar8 = BTOR2_TAG_one;
    }
    else {
      iVar2 = strcmp(pcVar7,"ones");
      if (iVar2 != 0) {
        if ((pcVar7[1] != 'r') || (pcVar7[2] != '\0')) {
          iVar2 = strcmp(pcVar7,"output");
          if (iVar2 == 0) {
            pcVar7 = "output";
            BVar8 = BTOR2_TAG_output;
            goto LAB_00101f91;
          }
          goto switchD_00101798_caseD_67;
        }
        pcVar7 = "or";
        BVar8 = BTOR2_TAG_or;
        break;
      }
      pcVar7 = "ones";
      BVar8 = BTOR2_TAG_ones;
    }
LAB_00102102:
    l = new_line_bfr(bfr,id,lineno,pcVar7,BVar8);
    iVar2 = parse_constant_bfr(bfr,l);
    goto LAB_001026fe;
  case 'r':
    iVar2 = strcmp(pcVar7,"read");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar7,"redand");
      if (iVar2 == 0) {
        pcVar7 = "redand";
        BVar8 = BTOR2_TAG_redand;
      }
      else {
        iVar2 = strcmp(pcVar7,"redor");
        if (iVar2 == 0) {
          pcVar7 = "redor";
          BVar8 = BTOR2_TAG_redor;
        }
        else {
          iVar2 = strcmp(pcVar7,"redxor");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar7,"rol");
            if (iVar2 == 0) {
              pcVar7 = "rol";
              BVar8 = BTOR2_TAG_rol;
            }
            else {
              iVar2 = strcmp(pcVar7,"ror");
              if (iVar2 != 0) goto switchD_00101798_caseD_67;
              pcVar7 = "ror";
              BVar8 = BTOR2_TAG_ror;
            }
            break;
          }
          pcVar7 = "redxor";
          BVar8 = BTOR2_TAG_redxor;
        }
      }
      goto LAB_001020d6;
    }
    pcVar7 = "read";
    BVar8 = BTOR2_TAG_read;
    break;
  case 's':
    iVar2 = strcmp(pcVar7,"saddo");
    if (iVar2 == 0) {
      pcVar7 = "saddo";
      BVar8 = BTOR2_TAG_saddo;
      break;
    }
    iVar2 = strcmp(pcVar7,"sext");
    if (iVar2 == 0) {
      pcVar7 = "sext";
      BVar8 = BTOR2_TAG_sext;
LAB_00102054:
      l = new_line_bfr(bfr,id,lineno,pcVar7,BVar8);
      iVar2 = parse_ext_bfr(bfr,l);
      goto LAB_001026fe;
    }
    iVar2 = strcmp(pcVar7,"sgt");
    if (iVar2 == 0) {
      pcVar7 = "sgt";
      BVar8 = BTOR2_TAG_sgt;
      break;
    }
    iVar2 = strcmp(pcVar7,"sgte");
    if (iVar2 == 0) {
      pcVar7 = "sgte";
      BVar8 = BTOR2_TAG_sgte;
      break;
    }
    iVar2 = strcmp(pcVar7,"sdiv");
    if (iVar2 == 0) {
      pcVar7 = "sdiv";
      BVar8 = BTOR2_TAG_sdiv;
      break;
    }
    iVar2 = strcmp(pcVar7,"sdivo");
    if (iVar2 == 0) {
      pcVar7 = "sdivo";
      BVar8 = BTOR2_TAG_sdivo;
      break;
    }
    iVar2 = strcmp(pcVar7,"slice");
    if (iVar2 != 0) {
      iVar2 = strcmp(pcVar7,"sll");
      if (iVar2 == 0) {
        pcVar7 = "sll";
        BVar8 = BTOR2_TAG_sll;
      }
      else {
        iVar2 = strcmp(pcVar7,"slt");
        if (iVar2 == 0) {
          pcVar7 = "slt";
          BVar8 = BTOR2_TAG_slt;
        }
        else {
          iVar2 = strcmp(pcVar7,"slte");
          if (iVar2 == 0) {
            pcVar7 = "slte";
            BVar8 = BTOR2_TAG_slte;
          }
          else {
            iVar2 = strcmp(pcVar7,"sort");
            if (iVar2 == 0) {
              l = new_line_bfr(bfr,id,lineno,"sort",BTOR2_TAG_sort);
              pcVar7 = parse_tag(bfr);
              if (pcVar7 == (char *)0x0) {
                return 0;
              }
              iVar2 = strcmp(pcVar7,"bitvec");
              if (iVar2 == 0) {
                tmp.tag = BTOR2_TAG_SORT_bitvec;
                tmp.name = "bitvec";
                iVar1 = parse_pos_number_bfr(bfr,&tmp.field_3.bitvec.width);
                if (iVar1 == 0) {
                  return 0;
                }
                if (tmp.field_3.bitvec.width == 0) {
                  pcVar7 = "bit width must be greater than 0";
                  goto LAB_001017dd;
                }
              }
              else {
                iVar2 = strcmp(pcVar7,"array");
                if (iVar2 != 0) {
                  pcVar7 = "invalid sort tag";
                  goto LAB_001017dd;
                }
                tmp.tag = BTOR2_TAG_SORT_array;
                tmp.name = "array";
                local_58.id = 0;
                iVar1 = parse_sort_id_bfr(bfr,&local_58);
                if (iVar1 == 0) {
                  return 0;
                }
                iVar1 = getc_bfr(bfr);
                if (iVar1 != 0x20) {
                  pcVar7 = "expected space";
                  goto LAB_001017dd;
                }
                tmp.field_3.array.index = local_58.id;
                iVar1 = parse_sort_id_bfr(bfr,&local_58);
                if (iVar1 == 0) {
                  return 0;
                }
                tmp.field_3.array.element = local_58.id;
              }
              tmp.id = l->id;
              (l->sort).field_3.array.element = tmp.field_3.array.element;
              (l->sort).name = tmp.name;
              (l->sort).field_3.array.index = tmp.field_3.array.index;
              (l->sort).id = tmp.id;
              *(ulong *)&(l->sort).tag = CONCAT44(tmp._12_4_,tmp.tag);
              goto LAB_00102706;
            }
            iVar2 = strcmp(pcVar7,"smod");
            if (iVar2 == 0) {
              pcVar7 = "smod";
              BVar8 = BTOR2_TAG_smod;
            }
            else {
              iVar2 = strcmp(pcVar7,"smulo");
              if (iVar2 == 0) {
                pcVar7 = "smulo";
                BVar8 = BTOR2_TAG_smulo;
              }
              else {
                iVar2 = strcmp(pcVar7,"ssubo");
                if (iVar2 == 0) {
                  pcVar7 = "ssubo";
                  BVar8 = BTOR2_TAG_ssubo;
                }
                else {
                  iVar2 = strcmp(pcVar7,"sra");
                  if (iVar2 == 0) {
                    pcVar7 = "sra";
                    BVar8 = BTOR2_TAG_sra;
                  }
                  else {
                    iVar2 = strcmp(pcVar7,"srl");
                    if (iVar2 == 0) {
                      pcVar7 = "srl";
                      BVar8 = BTOR2_TAG_srl;
                    }
                    else {
                      iVar2 = strcmp(pcVar7,"srem");
                      if (iVar2 == 0) {
                        pcVar7 = "srem";
                        BVar8 = BTOR2_TAG_srem;
                      }
                      else {
                        iVar2 = strcmp(pcVar7,"state");
                        if (iVar2 == 0) {
                          pcVar7 = "state";
                          BVar8 = BTOR2_TAG_state;
                          goto LAB_0010225a;
                        }
                        iVar2 = strcmp(pcVar7,"sub");
                        if (iVar2 != 0) goto switchD_00101798_caseD_67;
                        pcVar7 = "sub";
                        BVar8 = BTOR2_TAG_sub;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    }
    l = new_line_bfr(bfr,id,lineno,"slice",BTOR2_TAG_slice);
    iVar1 = parse_ext_bfr(bfr,l);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = getc_bfr(bfr);
    if (iVar1 != 0x20) {
      pcVar7 = "expected space after second argument";
      goto LAB_001017dd;
    }
    iVar1 = parse_pos_number_bfr(bfr,(uint32_t *)&tmp);
    if (iVar1 == 0) {
      return 0;
    }
    piVar3 = l->args;
    piVar3[2] = tmp.id & 0xffffffffU;
    if (piVar3[1] < (long)(tmp.id & 0xffffffffU)) {
      pcVar7 = "lower has to be less than or equal to upper";
      goto LAB_001017dd;
    }
    goto LAB_00102706;
  case 'u':
    iVar2 = strcmp(pcVar7,"uaddo");
    if (iVar2 == 0) {
      pcVar7 = "uaddo";
      BVar8 = BTOR2_TAG_uaddo;
    }
    else {
      iVar2 = strcmp(pcVar7,"udiv");
      if (iVar2 == 0) {
        pcVar7 = "udiv";
        BVar8 = BTOR2_TAG_udiv;
      }
      else {
        iVar2 = strcmp(pcVar7,"uext");
        if (iVar2 == 0) {
          pcVar7 = "uext";
          BVar8 = BTOR2_TAG_uext;
          goto LAB_00102054;
        }
        iVar2 = strcmp(pcVar7,"ugt");
        if (iVar2 == 0) {
          pcVar7 = "ugt";
          BVar8 = BTOR2_TAG_ugt;
        }
        else {
          iVar2 = strcmp(pcVar7,"ugte");
          if (iVar2 == 0) {
            pcVar7 = "ugte";
            BVar8 = BTOR2_TAG_ugte;
          }
          else {
            iVar2 = strcmp(pcVar7,"ult");
            if (iVar2 == 0) {
              pcVar7 = "ult";
              BVar8 = BTOR2_TAG_ult;
            }
            else {
              iVar2 = strcmp(pcVar7,"ulte");
              if (iVar2 == 0) {
                pcVar7 = "ulte";
                BVar8 = BTOR2_TAG_ulte;
              }
              else {
                iVar2 = strcmp(pcVar7,"umulo");
                if (iVar2 == 0) {
                  pcVar7 = "umulo";
                  BVar8 = BTOR2_TAG_umulo;
                }
                else {
                  iVar2 = strcmp(pcVar7,"urem");
                  if (iVar2 == 0) {
                    pcVar7 = "urem";
                    BVar8 = BTOR2_TAG_urem;
                  }
                  else {
                    iVar2 = strcmp(pcVar7,"usubo");
                    if (iVar2 != 0) goto switchD_00101798_caseD_67;
                    pcVar7 = "usubo";
                    BVar8 = BTOR2_TAG_usubo;
                  }
                }
              }
            }
          }
        }
      }
    }
    break;
  case 'w':
    iVar2 = strcmp(pcVar7,"write");
    if (iVar2 == 0) {
      pcVar7 = "write";
      BVar8 = BTOR2_TAG_write;
LAB_00101df4:
      l = new_line_bfr(bfr,id,lineno,pcVar7,BVar8);
      iVar2 = parse_ternary_op_bfr(bfr,l);
      goto LAB_001026fe;
    }
    goto switchD_00101798_caseD_67;
  case 'x':
    iVar2 = strcmp(pcVar7,"xnor");
    if (iVar2 == 0) {
      pcVar7 = "xnor";
      BVar8 = BTOR2_TAG_xnor;
    }
    else {
      iVar2 = strcmp(pcVar7,"xor");
      if (iVar2 != 0) goto switchD_00101798_caseD_67;
      pcVar7 = "xor";
      BVar8 = BTOR2_TAG_xor;
    }
    break;
  case 'z':
    iVar2 = strcmp(pcVar7,"zero");
    if (iVar2 == 0) {
      pcVar7 = "zero";
      BVar8 = BTOR2_TAG_zero;
      goto LAB_00102102;
    }
switchD_00101798_caseD_67:
    fmt = "invalid tag \'%s\'";
LAB_00101f2c:
    perr_bfr(bfr,fmt,pcVar7);
    return 0;
  }
  l = new_line_bfr(bfr,id,lineno,pcVar7,BVar8);
  iVar2 = parse_binary_op_bfr(bfr,l);
LAB_001026fe:
  if (iVar2 == 0) {
    return 0;
  }
LAB_00102706:
  pusht_bfr(bfr,l);
  iVar2 = check_sorts_bfr(bfr,l);
joined_r0x001025d2:
  if (iVar2 == 0) {
    return 0;
  }
  iVar1 = parse_opt_symbol_bfr(bfr,l);
  return iVar1;
}

Assistant:

static int32_t
readl_bfr (Btor2Parser *bfr)
{
  const char *tag;
  int64_t lineno;
  int64_t id;
  int32_t ch;
START:
  // skip white spaces at the beginning of the line
  while ((ch = getc_bfr (bfr)) == ' ')
    ;
  if (ch == EOF) return 0;
  if (ch == '\n') goto START;
  if (ch == '\t')
    return perr_bfr (bfr, "unexpected tab character at start of line");
  if (ch == ';')
  {
    if (!skip_comment (bfr)) return 0;
    goto START;
  }
  ungetc_bfr (bfr, ch);
  if (!parse_id_bfr (bfr, &id)) return 0;
  if (getc_bfr (bfr) != ' ') return perr_bfr (bfr, "expected space after id");
  if (id < bfr->ntable)
  {
    if (id2line_bfr (bfr, id) != 0) return perr_bfr (bfr, "id already defined");
    return perr_bfr (bfr, "id out-of-order");
  }
  lineno = bfr->lineno;
  tag    = parse_tag (bfr);
  if (!tag) return 0;
  switch (tag[0])
  {
    case 'a':
      PARSE (add, binary_op);
      PARSE (and, binary_op);
      break;
    case 'b': PARSE (bad, constraint); break;
    case 'c':
      PARSE (constraint, constraint);
      PARSE (concat, binary_op);
      PARSE (const, constant);
      PARSE (constd, constant);
      PARSE (consth, constant);
      break;
    case 'd': PARSE (dec, unary_op); break;
    case 'e': PARSE (eq, binary_op); break;
    case 'f': PARSE (fair, constraint); break;
    case 'i':
      PARSE (implies, binary_op);
      PARSE (iff, binary_op);
      PARSE (inc, unary_op);
      PARSE (init, init);
      PARSE (input, input);
      PARSE (ite, ternary_op);
      break;
    case 'j': PARSE (justice, justice); break;
    case 'm': PARSE (mul, binary_op); break;
    case 'n':
      PARSE (nand, binary_op);
      PARSE (neq, binary_op);
      PARSE (neg, unary_op);
      PARSE (next, next);
      PARSE (nor, binary_op);
      PARSE (not, unary_op);
      break;
    case 'o':
      PARSE (one, constant);
      PARSE (ones, constant);
      PARSE (or, binary_op);
      PARSE (output, constraint);
      break;
    case 'r':
      PARSE (read, binary_op);
      PARSE (redand, unary_op);
      PARSE (redor, unary_op);
      PARSE (redxor, unary_op);
      PARSE (rol, binary_op);
      PARSE (ror, binary_op);
      break;
    case 's':
      PARSE (saddo, binary_op);
      PARSE (sext, ext);
      PARSE (sgt, binary_op);
      PARSE (sgte, binary_op);
      PARSE (sdiv, binary_op);
      PARSE (sdivo, binary_op);
      PARSE (slice, slice);
      PARSE (sll, binary_op);
      PARSE (slt, binary_op);
      PARSE (slte, binary_op);
      PARSE (sort, sort);
      PARSE (smod, binary_op);
      PARSE (smulo, binary_op);
      PARSE (ssubo, binary_op);
      PARSE (sra, binary_op);
      PARSE (srl, binary_op);
      PARSE (srem, binary_op);
      PARSE (state, input);
      PARSE (sub, binary_op);
      break;
    case 'u':
      PARSE (uaddo, binary_op);
      PARSE (udiv, binary_op);
      PARSE (uext, ext);
      PARSE (ugt, binary_op);
      PARSE (ugte, binary_op);
      PARSE (ult, binary_op);
      PARSE (ulte, binary_op);
      PARSE (umulo, binary_op);
      PARSE (urem, binary_op);
      PARSE (usubo, binary_op);
      break;
    case 'w': PARSE (write, ternary_op); break;
    case 'x':
      PARSE (xnor, binary_op);
      PARSE (xor, binary_op);
      break;
    case 'z': PARSE (zero, constant); break;
  }
  return perr_bfr (bfr, "invalid tag '%s'", tag);
}